

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flc_mapFORTRAN_wrap.cxx
# Opt level: O0

void SWIG_assign<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,(swig::AssignmentType)0>
               (SwigClassWrapper *self,SwigClassWrapper other)

{
  SwigClassWrapper self_00;
  SwigClassWrapper other_00;
  SwigClassWrapper self_01;
  ulong in_RDX;
  swig *in_RSI;
  SwigClassWrapper *in_RDI;
  SwigClassWrapper other_01;
  SwigClassWrapper other_02;
  SwigClassWrapper SVar1;
  void *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 uStack_ac;
  void *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uStack_7c;
  undefined4 uStack_5c;
  undefined4 uStack_3c;
  undefined4 uStack_1c;
  undefined4 uStack_4;
  
  if (in_RDI->cptr == (void *)0x0) {
    if ((in_RDX & 2) == 0) {
      other_02.cptr = (void *)(in_RDX & 0xffffffff);
      other_02._8_8_ = in_RDX;
      SVar1 = swig::
              AssignmentPolicy<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(swig::AssignmentType)0>
              ::alias((AssignmentPolicy<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(swig::AssignmentType)0>
                       *)in_RSI,other_02);
      in_RDI->cptr = SVar1.cptr;
      *(ulong *)&in_RDI->cmemflags = CONCAT44(uStack_3c,SVar1.cmemflags);
    }
    else {
      other_01.cptr = (void *)(in_RDX & 0xffffffff);
      other_01._8_8_ = in_RDX;
      SVar1 = swig::capture(in_RSI,other_01);
      in_RDI->cptr = SVar1.cptr;
      *(ulong *)&in_RDI->cmemflags = CONCAT44(uStack_1c,SVar1.cmemflags);
    }
  }
  else if (in_RSI == (swig *)0x0) {
    self_00._8_8_ = in_stack_ffffffffffffff40;
    self_00.cptr = in_stack_ffffffffffffff38;
    SVar1 = swig::
            AssignmentPolicy<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(swig::AssignmentType)0>
            ::destroy(self_00);
    in_RDI->cptr = SVar1.cptr;
    *(ulong *)&in_RDI->cmemflags = CONCAT44(uStack_5c,SVar1.cmemflags);
  }
  else if ((swig *)in_RDI->cptr != in_RSI) {
    if ((in_RDX & 2) == 0) {
      self_01._8_8_ = in_stack_ffffffffffffff70;
      self_01.cptr = in_stack_ffffffffffffff68;
      SVar1._8_8_ = in_stack_ffffffffffffff60;
      SVar1.cptr = in_stack_ffffffffffffff58;
      SVar1 = swig::
              AssignmentPolicy<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(swig::AssignmentType)0>
              ::copy_alias(self_01,SVar1);
      in_RDI->cptr = SVar1.cptr;
      *(ulong *)&in_RDI->cmemflags = CONCAT44(uStack_ac,SVar1.cmemflags);
    }
    else {
      other_00._12_4_ = uStack_4;
      other_00.cmemflags = (int)in_RDX;
      other_00.cptr = in_RSI;
      SVar1 = swig::
              AssignmentPolicy<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(swig::AssignmentType)0>
              ::move_alias(*in_RDI,other_00);
      in_RDI->cptr = SVar1.cptr;
      *(ulong *)&in_RDI->cmemflags = CONCAT44(uStack_7c,SVar1.cmemflags);
    }
  }
  return;
}

Assistant:

SWIGINTERN void SWIG_assign(SwigClassWrapper* self, SwigClassWrapper other) {
  typedef swig::AssignmentPolicy<T, A> Policy_t;

  if (self->cptr == NULL) {
    /* LHS is unassigned */
    if (other.cmemflags & SWIG_MEM_RVALUE) {
      /* Capture pointer from RHS, clear 'moving' flag */
      *self = swig::capture(other);
    } else {
      /* Aliasing another class; clear ownership or copy smart pointer */
      *self = Policy_t::alias(other);
    }
  } else if (other.cptr == NULL) {
    /* Replace LHS with a null pointer */
    *self = Policy_t::destroy(*self);
  } else if (self->cptr == other.cptr) {
    /* Self-assignment: ignore */
  } else if (other.cmemflags & SWIG_MEM_RVALUE) {
    /* Transferred ownership from a variable that's about to be lost.
     * Move-assign and delete the transient data */
    *self = Policy_t::move_alias(*self, other);
  } else {
    /* RHS shouldn't be deleted, alias to LHS */
    *self = Policy_t::copy_alias(*self, other);
  }
}